

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O0

void __thiscall QCompleter::setWidget(QCompleter *this,QWidget *widget)

{
  long lVar1;
  bool bVar2;
  QCompleterPrivate *pQVar3;
  QWidget *pQVar4;
  long in_FS_OFFSET;
  QCompleterPrivate *d;
  QWidget *in_stack_ffffffffffffffc8;
  QPointer<QWidget> *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QCompleter *)0xa6e27f);
  bVar2 = ::operator==((QWidget **)in_stack_ffffffffffffffd0,
                       (QPointer<QWidget> *)in_stack_ffffffffffffffc8);
  if (!bVar2) {
    bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0xa6e2b0);
    if (bVar2) {
      pQVar4 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0xa6e2c4);
      QObject::removeEventFilter(&pQVar4->super_QObject);
    }
    QPointer<QWidget>::operator=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0xa6e2f2);
    if (bVar2) {
      pQVar4 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0xa6e306);
      QObject::installEventFilter(&pQVar4->super_QObject);
    }
    if (pQVar3->popup != (QAbstractItemView *)0x0) {
      QWidget::hide((QWidget *)0xa6e333);
      ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0xa6e352);
      QWidget::setFocusProxy(widget,(QWidget *)this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCompleter::setWidget(QWidget *widget)
{
    Q_D(QCompleter);
    if (widget == d->widget)
        return;

    if (d->widget)
        d->widget->removeEventFilter(this);
    d->widget = widget;
    if (d->widget)
        d->widget->installEventFilter(this);

    if (d->popup) {
        d->popup->hide();
        d->popup->setFocusProxy(d->widget);
    }
}